

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow *window)

{
  ImGui_ImplGlfw_Data *cbfun;
  GLFWwindowfocusfun p_Var1;
  GLFWcursorenterfun p_Var2;
  GLFWcursorposfun p_Var3;
  GLFWmousebuttonfun p_Var4;
  GLFWscrollfun p_Var5;
  GLFWkeyfun p_Var6;
  GLFWcharfun p_Var7;
  GLFWmonitorfun p_Var8;
  GLFWwindow *in_RDI;
  ImGui_ImplGlfw_Data *bd;
  GLFWmonitorfun in_stack_ffffffffffffffe8;
  
  cbfun = ImGui_ImplGlfw_GetBackendData();
  p_Var1 = glfwSetWindowFocusCallback(in_RDI,(GLFWwindowfocusfun)cbfun);
  cbfun->PrevUserCallbackWindowFocus = p_Var1;
  p_Var2 = glfwSetCursorEnterCallback(in_RDI,(GLFWcursorenterfun)cbfun);
  cbfun->PrevUserCallbackCursorEnter = p_Var2;
  p_Var3 = glfwSetCursorPosCallback(in_RDI,(GLFWcursorposfun)cbfun);
  cbfun->PrevUserCallbackCursorPos = p_Var3;
  p_Var4 = glfwSetMouseButtonCallback(in_RDI,(GLFWmousebuttonfun)cbfun);
  cbfun->PrevUserCallbackMousebutton = p_Var4;
  p_Var5 = glfwSetScrollCallback(in_RDI,(GLFWscrollfun)cbfun);
  cbfun->PrevUserCallbackScroll = p_Var5;
  p_Var6 = glfwSetKeyCallback(in_RDI,(GLFWkeyfun)cbfun);
  cbfun->PrevUserCallbackKey = p_Var6;
  p_Var7 = glfwSetCharCallback(in_RDI,(GLFWcharfun)cbfun);
  cbfun->PrevUserCallbackChar = p_Var7;
  p_Var8 = glfwSetMonitorCallback(in_stack_ffffffffffffffe8);
  cbfun->PrevUserCallbackMonitor = p_Var8;
  cbfun->InstalledCallbacks = true;
  return;
}

Assistant:

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == false && "Callbacks already installed!");
    IM_ASSERT(bd->Window == window);

    bd->PrevUserCallbackWindowFocus = glfwSetWindowFocusCallback(window, ImGui_ImplGlfw_WindowFocusCallback);
    bd->PrevUserCallbackCursorEnter = glfwSetCursorEnterCallback(window, ImGui_ImplGlfw_CursorEnterCallback);
    bd->PrevUserCallbackCursorPos = glfwSetCursorPosCallback(window, ImGui_ImplGlfw_CursorPosCallback);
    bd->PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
    bd->PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
    bd->PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
    bd->PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    bd->PrevUserCallbackMonitor = glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
    bd->InstalledCallbacks = true;
}